

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
          (locator *__return_storage_ptr__,void *this,arrays_type *arrays_,size_t pos0,size_t hash,
          try_emplace_args_t *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          PortInfo *args_2)

{
  char *pcVar1;
  byte *pbVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ushort uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  undefined8 *puVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  lVar3 = *(long *)((long)this + 0x10);
  lVar8 = (long)arrays_ * 0x10;
  pcVar1 = (char *)(lVar3 + lVar8);
  auVar14[0] = -(*pcVar1 == '\0');
  auVar14[1] = -(pcVar1[1] == '\0');
  auVar14[2] = -(pcVar1[2] == '\0');
  auVar14[3] = -(pcVar1[3] == '\0');
  auVar14[4] = -(pcVar1[4] == '\0');
  auVar14[5] = -(pcVar1[5] == '\0');
  auVar14[6] = -(pcVar1[6] == '\0');
  auVar14[7] = -(pcVar1[7] == '\0');
  auVar14[8] = -(pcVar1[8] == '\0');
  auVar14[9] = -(pcVar1[9] == '\0');
  auVar14[10] = -(pcVar1[10] == '\0');
  auVar14[0xb] = -(pcVar1[0xb] == '\0');
  auVar14[0xc] = -(pcVar1[0xc] == '\0');
  auVar14[0xd] = -(pcVar1[0xd] == '\0');
  auVar14[0xe] = -(pcVar1[0xe] == '\0');
  auVar14[0xf] = -(pcVar1[0xf] == '\0');
  uVar12 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
  if (uVar12 == 0) {
    uVar4 = *(ulong *)((long)this + 8);
    lVar9 = 1;
    do {
      pbVar2 = (byte *)(lVar3 + 0xf + (long)arrays_ * 0x10);
      *pbVar2 = *pbVar2 | '\x01' << ((byte)pos0 & 7);
      arrays_ = (arrays_type *)((long)&arrays_->groups_size_index + lVar9 & uVar4);
      lVar8 = (long)arrays_ * 0x10;
      pcVar1 = (char *)(lVar3 + lVar8);
      auVar15[0] = -(*pcVar1 == '\0');
      auVar15[1] = -(pcVar1[1] == '\0');
      auVar15[2] = -(pcVar1[2] == '\0');
      auVar15[3] = -(pcVar1[3] == '\0');
      auVar15[4] = -(pcVar1[4] == '\0');
      auVar15[5] = -(pcVar1[5] == '\0');
      auVar15[6] = -(pcVar1[6] == '\0');
      auVar15[7] = -(pcVar1[7] == '\0');
      auVar15[8] = -(pcVar1[8] == '\0');
      auVar15[9] = -(pcVar1[9] == '\0');
      auVar15[10] = -(pcVar1[10] == '\0');
      auVar15[0xb] = -(pcVar1[0xb] == '\0');
      auVar15[0xc] = -(pcVar1[0xc] == '\0');
      auVar15[0xd] = -(pcVar1[0xd] == '\0');
      auVar15[0xe] = -(pcVar1[0xe] == '\0');
      auVar15[0xf] = -(pcVar1[0xf] == '\0');
      uVar6 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
      uVar12 = (uint)uVar6;
      lVar9 = lVar9 + 1;
    } while (uVar6 == 0);
  }
  uVar5 = 0;
  if (uVar12 != 0) {
    for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  lVar9 = (long)arrays_ * 0x528 + *(long *)((long)this + 0x18);
  lVar11 = (ulong)uVar5 * 0x58;
  uVar7 = *(undefined8 *)(hash + 8);
  puVar13 = (undefined8 *)(lVar11 + lVar9);
  *puVar13 = *(undefined8 *)hash;
  puVar13[1] = uVar7;
  puVar13 = puVar13 + 2;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar13 = *(undefined8 *)args;
    args = args + 8;
    puVar13 = puVar13 + 1;
  }
  ((group15<boost::unordered::detail::foa::plain_integral> *)(lVar3 + lVar8))->m[uVar5].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (pos0 & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(lVar3 + lVar8);
  __return_storage_ptr__->n = uVar5;
  __return_storage_ptr__->p =
       (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
        *)(lVar9 + lVar11);
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }